

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O2

void dump_elist(char *name,zt_elist_t *p)

{
  zt_elist_t *pzVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  char *__format;
  zt_elist **ppzVar8;
  
  printf("%s %p [",name,p);
  ppzVar8 = &p->next;
  iVar7 = 0;
  bVar4 = true;
  while (pzVar1 = *ppzVar8, pzVar1 != p) {
    bVar3 = false;
    if (pzVar1->next != p) {
      bVar3 = bVar4;
    }
    pcVar6 = "";
    if (bVar3) {
      pcVar6 = ", ";
    }
    __format = "%p%s";
    if (((ulong)pzVar1[1].prev & 2) != 0) {
      __format = "p(%p)%s";
    }
    ppzVar8 = &pzVar1->next;
    printf(__format,pzVar1,pcVar6);
    bVar2 = 8 < iVar7;
    iVar7 = iVar7 + 1;
    bVar4 = bVar3;
    if (bVar2) {
      sVar5 = strlen(name);
      iVar7 = 0;
      printf("\n%*s",(ulong)((int)sVar5 + 2),"");
    }
  }
  puts("]");
  return;
}

Assistant:

static void
dump_elist(char *name, zt_elist_t *p)
{
    zt_elist_t * tmp;
    int        c;
    int        count;

    printf("%s %p [", name, (void *)p);
    c = 1;
    count = 0;
    zt_elist_for_each(p, tmp) {
        if (tmp->next == p) {
            c = 0;
        }
        if (is_protected(zt_elist_data(tmp, zt_gc_collectable_t, list))) {
            printf("p(%p)%s", (void *)tmp, c ? ", " : "");
        } else {
            printf("%p%s", (void *)tmp, c ? ", " : "");
        }
        if (++count >= 10) {
            printf("\n" BLANK, INDENT_TO(strlen(name) + 2, 1, 0));
            count = 0;
        }
    }
    printf("]\n");
}